

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-bits.h
# Opt level: O0

int read_bits(coda_product *product,int64_t bit_offset,int64_t bit_length,uint8_t *dst)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  sbyte sVar6;
  ulong uVar7;
  long byte_offset;
  ulong local_78;
  unsigned_long i;
  unsigned_long num_bytes_set;
  unsigned_long num_bytes_read;
  unsigned_long mod24_bit_length;
  undefined1 local_4d;
  anon_union_4_2_99f8264b data;
  uint8_t buffer_1 [4];
  ulong uStack_48;
  uint8_t buffer;
  unsigned_long trailing_bit_length;
  int64_t padded_bit_length;
  unsigned_long bit_shift;
  uint8_t *dst_local;
  int64_t bit_length_local;
  int64_t bit_offset_local;
  coda_product *product_local;
  
  lVar3 = (bit_offset & 7U) + bit_length;
  uVar4 = -lVar3 & 7;
  byte_offset = bit_offset >> 3;
  sVar6 = (sbyte)uVar4;
  if (lVar3 < 9) {
    iVar1 = read_bytes(product,byte_offset,1,dst);
    if (iVar1 != 0) {
      return -1;
    }
    if (uVar4 != 0) {
      *dst = (uint8_t)((int)(uint)*dst >> sVar6);
    }
    if ((bit_length & 7U) != 0) {
      *dst = *dst & (char)(1 << ((byte)bit_length & 0x1f)) - 1U;
    }
  }
  else {
    bit_shift = (unsigned_long)dst;
    dst_local = (uint8_t *)bit_length;
    bit_length_local = bit_offset;
    if (uVar4 == 0) {
      if ((bit_length & 7U) != 0) {
        iVar1 = read_bytes(product,byte_offset,1,data.as_bytes + 3);
        if (iVar1 != 0) {
          return -1;
        }
        uStack_48 = bit_length & 7;
        *dst = data.as_bytes[3] & (char)(1 << (sbyte)uStack_48) - 1U;
        bit_shift = (unsigned_long)(dst + 1);
        bit_length_local = uStack_48 + bit_offset;
        dst_local = (uint8_t *)(bit_length - uStack_48);
      }
      if ((0 < (long)dst_local) &&
         (iVar1 = read_bytes(product,bit_length_local >> 3,(long)dst_local >> 3,(void *)bit_shift),
         iVar1 != 0)) {
        return -1;
      }
    }
    else {
      if (bit_length % 0x18 != 0) {
        uVar7 = bit_length % 0x18;
        uVar4 = ((bit_offset & 7U) + uVar7 >> 3) +
                (long)(int)(uint)((((byte)bit_offset & 7) + (byte)uVar7 & 7) != 0);
        uVar5 = (uVar7 >> 3) + (long)(int)(uint)((uVar7 & 7) != 0);
        iVar1 = read_bytes(product,byte_offset,uVar4,&local_4d);
        if (iVar1 != 0) {
          return -1;
        }
        mod24_bit_length._4_4_ = 0;
        for (local_78 = 0; local_78 < uVar4; local_78 = local_78 + 1) {
          *(undefined1 *)((long)&mod24_bit_length + (7 - local_78)) = (&local_4d)[local_78];
        }
        mod24_bit_length._4_4_ =
             0U >> (sVar6 + ('\x04' - (char)uVar4) * '\b' & 0x1fU) &
             (1 << ((byte)uVar7 & 0x1f)) - 1U;
        for (local_78 = 0; local_78 < uVar5; local_78 = local_78 + 1) {
          dst[local_78] = *(uint8_t *)((long)&mod24_bit_length + (uVar5 - local_78) + 3);
        }
        bit_shift = (unsigned_long)(dst + uVar5);
        bit_length_local = uVar7 + bit_offset;
        dst_local = (uint8_t *)(bit_length - uVar7);
      }
      for (; 0 < (long)dst_local; dst_local = dst_local + -0x18) {
        iVar1 = read_bytes(product,bit_length_local >> 3,4,&local_4d);
        if (iVar1 != 0) {
          return -1;
        }
        mod24_bit_length._4_4_ =
             CONCAT13(local_4d,CONCAT12(data.as_bytes[0],CONCAT11(data.as_bytes[1],data.as_bytes[2])
                                       ));
        uVar2 = mod24_bit_length._4_4_ >> sVar6;
        mod24_bit_length._6_1_ = (undefined1)(uVar2 >> 0x10);
        *(undefined1 *)bit_shift = mod24_bit_length._6_1_;
        mod24_bit_length._5_1_ = (undefined1)(uVar2 >> 8);
        *(undefined1 *)(bit_shift + 1) = mod24_bit_length._5_1_;
        mod24_bit_length._4_1_ = (undefined1)uVar2;
        *(undefined1 *)(bit_shift + 2) = mod24_bit_length._4_1_;
        bit_shift = bit_shift + 3;
        bit_length_local = bit_length_local + 0x18;
        mod24_bit_length._4_4_ = uVar2;
      }
    }
  }
  return 0;
}

Assistant:

static int read_bits(coda_product *product, int64_t bit_offset, int64_t bit_length, uint8_t *dst)
{
    unsigned long bit_shift;
    int64_t padded_bit_length;

    /* we read bits by treating them as big endian numbers.
     * This means that
     *
     *      src[0]     |    src[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  . . a b c d e f|g h i j k . . .
     *
     * will be read and shifted to get
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  . . . . . a b c|d e f g h i j k
     * 
     * If the value is a number then on little endian machines the value needs to be converted to:
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  d e f g h i j k|0 0 0 0 0 a b c
     *
     * Note that endian conversion does not happen within this function but happens in the functions that call
     * read_bits().
     *
     * In theory we could also implement support for bitdata stored in lsb (least significant bit) to msb order.
     * However, such a feature is currently NOT implemented!
     * If we ever implement such a feature it should look like this:
     * If the format of the source is (note the reverse order in which we display the bits!):
     *
     *      src[0]     |    src[1]
     *  0 1 2 3 4 5 6 7|0 1 2 3 4 5 6 7
     *  . . a b c d e f|g h i j k . . .
     *
     * then this will be read as
     *
     *      tmp[0]     |    tmp[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  f e d c b a . .|. . . k j i h g
     *
     * we can then perform a shift of bits (shifting 2 least significant bits from the right byte to the left byte)
     * to get the little endian result
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  h g f e d c b a|. . . . . k j i
     *
     * On big endian machines this can then be turned into a big endian number
     *
     *      dst[0]     |    dst[1]
     *  7 6 5 4 3 2 1 0|7 6 5 4 3 2 1 0
     *  0 0 0 0 0 k j i|h g f e d c b a
     */

    /* The padded bit length is the number of 'padding' bits plus the bit length.
     * The 'padding' bits are the bits between the start of byte (i.e. starting at the most significant bit) and the
     * start of requested bits (in the (big endian) example above, bits 7 and 6 of src[0] are the padding bits).
     */
    padded_bit_length = (bit_offset & 0x7) + bit_length;
    bit_shift = (unsigned long)(-padded_bit_length & 0x7);
    if (padded_bit_length <= 8)
    {
        /* all bits are located within a single byte, so we will use an optimized approach to extract the bits */
        if (read_bytes(product, bit_offset >> 3, 1, dst) != 0)
        {
            return -1;
        }
        if (bit_shift != 0)
        {
            *dst >>= bit_shift;
        }
        if ((bit_length & 0x7) != 0)
        {
            *dst &= ((1 << bit_length) - 1);
        }
    }
    else if (bit_shift == 0)
    {
        /* no shifting needed for the source bytes */
        if (bit_length & 0x7)
        {
            unsigned long trailing_bit_length;
            uint8_t buffer;

            /* the first byte contains trailing bits and is not copied in full */
            if (read_bytes(product, bit_offset >> 3, 1, &buffer) != 0)
            {
                return -1;
            }
            trailing_bit_length = (unsigned long)(bit_length & 0x7);
            *dst = buffer & ((1 << trailing_bit_length) - 1);
            dst++;
            bit_offset += trailing_bit_length;
            bit_length -= trailing_bit_length;
        }
        if (bit_length > 0)
        {
            /* use a plain copy for the remaining bytes */
            if (read_bytes(product, bit_offset >> 3, bit_length >> 3, dst) != 0)
            {
                return -1;
            }
        }
    }
    else
    {
        uint8_t buffer[4];
        union
        {
            uint8_t as_bytes[4];
            uint32_t as_uint32;
        } data;

        /* we need to shift each byte */

        /* we first copy the part modulo 24 bits (so the rest can be processed in chuncks of 24 bits each) */
        if (bit_length % 24 != 0)
        {
            unsigned long mod24_bit_length;
            unsigned long num_bytes_read;
            unsigned long num_bytes_set;
            unsigned long i;

            mod24_bit_length = (unsigned long)(bit_length % 24);
            num_bytes_read = bit_size_to_byte_size(((unsigned long)(bit_offset & 0x7)) + mod24_bit_length);
            num_bytes_set = bit_size_to_byte_size(mod24_bit_length);
            if (read_bytes(product, bit_offset >> 3, num_bytes_read, buffer) != 0)
            {
                return -1;
            }
            data.as_uint32 = 0;
            for (i = 0; i < num_bytes_read; i++)
            {
#ifdef WORDS_BIGENDIAN
                data.as_bytes[i] = buffer[i];
#else
                data.as_bytes[3 - i] = buffer[i];
#endif
            }
            data.as_uint32 = (data.as_uint32 >> (bit_shift + 8 * (4 - num_bytes_read))) & ((1 << mod24_bit_length) - 1);
            for (i = 0; i < num_bytes_set; i++)
            {
#ifdef WORDS_BIGENDIAN
                dst[i] = data.as_bytes[(4 - num_bytes_set) + i];
#else
                dst[i] = data.as_bytes[(num_bytes_set - 1) - i];
#endif
            }
            dst += num_bytes_set;
            bit_offset += mod24_bit_length;
            bit_length -= mod24_bit_length;
        }

        /* we copy the remaining data in chunks of 24 bits (3 bytes) at a time */
        while (bit_length > 0)
        {
#ifdef WORDS_BIGENDIAN
            if (read_bytes(product, bit_offset >> 3, 4, data.as_bytes) != 0)
            {
                return -1;
            }
            data.as_uint32 >>= bit_shift;
            dst[0] = data.as_bytes[1];
            dst[1] = data.as_bytes[2];
            dst[2] = data.as_bytes[3];
#else
            if (read_bytes(product, bit_offset >> 3, 4, buffer) != 0)
            {
                return -1;
            }
            data.as_bytes[0] = buffer[3];
            data.as_bytes[1] = buffer[2];
            data.as_bytes[2] = buffer[1];
            data.as_bytes[3] = buffer[0];
            data.as_uint32 >>= bit_shift;
            dst[0] = data.as_bytes[2];
            dst[1] = data.as_bytes[1];
            dst[2] = data.as_bytes[0];
#endif
            dst += 3;
            bit_offset += 24;
            bit_length -= 24;
        }
    }

    return 0;
}